

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O3

void __thiscall senjo::UCIAdapter::~UCIAdapter(UCIAdapter *this)

{
  pointer pcVar1;
  
  this->_vptr_UCIAdapter = (_func_int **)&PTR__UCIAdapter_0015bad8;
  this->engine = (ChessEngine *)0x0;
  pcVar1 = (this->lastPosition)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->lastPosition).field_2) {
    operator_delete(pcVar1);
  }
  Thread::~Thread(&this->thread);
  return;
}

Assistant:

UCIAdapter::~UCIAdapter()
{
  engine = NULL;
}